

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

iterator __thiscall
QMap<QSettingsKey,_QVariant>::lowerBound(QMap<QSettingsKey,_QVariant> *this,QSettingsKey *key)

{
  QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
  local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_20.d.ptr ==
       (QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(((QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>
           *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_20.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_*>
          )(QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>
       *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>
                        *)local_20.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  pQVar1 = (this->d).d.ptr;
  iVar2 = std::
          _Rb_tree<QSettingsKey,_std::pair<const_QSettingsKey,_QVariant>,_std::_Select1st<std::pair<const_QSettingsKey,_QVariant>_>,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>
          ::_M_lower_bound(&(pQVar1->m)._M_t,
                           *(_Link_type *)
                            ((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8),
                           &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header,key);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (iterator)(iterator)iVar2._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator lowerBound(const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        return iterator(d->m.lower_bound(key));
    }